

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)23,_(unsigned_short)0>::Pack
               (uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  uVar1 = in[1];
  *out = (uint)uVar1 << 0x17 | (uint)*in & 0x7fffff;
  uVar2 = in[2];
  out[1] = (uint)uVar2 << 0xe | (uint)uVar1 >> 9 & 0x3fff;
  out[2] = (uint)uVar2 >> 0x12 & 0x1f;
  Unroller<(unsigned_short)23,_(unsigned_short)3>::Pack(in,out + 2);
  return;
}

Assistant:

static void Pack(const uint64_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in64<DELTA, (DELTA * OINDEX) % 32, (1ULL << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}